

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O0

nng_err nng_http_set_uri(nng_http *conn,char *uri,char *query)

{
  nng_err nVar1;
  char *query_local;
  char *uri_local;
  nng_http *conn_local;
  
  nVar1 = nni_http_set_uri(conn,uri,query);
  return nVar1;
}

Assistant:

nng_err
nng_http_set_uri(nng_http *conn, const char *uri, const char *query)
{
#ifdef NNG_SUPP_HTTP
	return (nni_http_set_uri(conn, uri, query));
#else
	NNI_ARG_UNUSED(conn);
	NNI_ARG_UNUSED(uri);
	NNI_ARG_UNUSED(query);
	return (NNG_ENOTSUP);
#endif
}